

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O3

int armci_check_contiguous(int *src_stride,int *dst_stride,int *count,int n_stride)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int local_58 [4];
  int dst_ld [7];
  int src_ld [7];
  
  dst_ld[4] = *src_stride;
  local_58[0] = *dst_stride;
  uVar8 = (ulong)(uint)n_stride;
  if (1 < n_stride) {
    uVar9 = 1;
    iVar7 = *src_stride;
    iVar6 = *dst_stride;
    do {
      iVar1 = src_stride[uVar9];
      dst_ld[uVar9 + 4] = iVar1 / iVar7;
      iVar2 = dst_stride[uVar9];
      local_58[uVar9] = iVar2 / iVar6;
      uVar9 = uVar9 + 1;
      iVar7 = iVar1;
      iVar6 = iVar2;
    } while (uVar8 != uVar9);
  }
  uVar5 = 1;
  if (0 < n_stride) {
    uVar9 = 0;
    bVar3 = false;
    do {
      iVar7 = count[uVar9];
      if (iVar7 < dst_ld[uVar9 + 4]) {
        bVar4 = true;
        if (bVar3) {
          return 0;
        }
      }
      else {
        if (iVar7 < local_58[uVar9] && bVar3) {
          return 0;
        }
        bVar4 = true;
        if ((local_58[uVar9] <= iVar7 || bVar3) && (bVar4 = bVar3, iVar7 != 1 && bVar3)) {
          return 0;
        }
      }
      bVar3 = bVar4;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    uVar5 = 1;
    if (bVar3 && 0 < n_stride) {
      uVar5 = (uint)(count[uVar8] == 1);
    }
  }
  return uVar5;
}

Assistant:

int armci_check_contiguous(int *src_stride, int *dst_stride,
    int *count, int n_stride)
{
#if 1
  /* This is code from the merge between CMX and the current develop branch
   * (2018/7/5) */
  int i;
  int ret = 1;
  int stridelen = 1;
  int gap = 0;
  int src_ld[7], dst_ld[7];
  /**
   * Calculate physical dimensions of buffers from stride arrays
   */
  src_ld[0] = src_stride[0];
  dst_ld[0] = dst_stride[0];
  for (i=1; i<n_stride; i++) {
    src_ld[i] = src_stride[i]/src_stride[i-1];
    dst_ld[i] = dst_stride[i]/dst_stride[i-1];
  }
  /* NOTE: The count array contains the length of the final dimension and can
   * be used to evaluate some corner cases
   */
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if ((count[i] < src_ld[i] || count[i] < dst_ld[i])
        && gap == 1) {
      /* Data is definitely strided in memory */
      ret = 0;
      break;
    } else if ((count[i] < src_ld[i] || count[i] < dst_ld[i]) &&
        gap == 0) {
      /* First dimension that doesn't match physical dimension */
      gap = 1;
    } else if (count[i] != 1 && gap == 1) {
      /* Found a mismatch between requested block and physical dimensions
       * indicating a possible stride in memory
       * */
      ret = 0;
      break;
    }
  }
  /**
   * Everything looks good up to this point but need to verify that last
   * dimension is 1 if a mismatch between requested block and physical
   * array dimensions has been found previously
   */
  if (gap == 1 && ret == 1 && n_stride > 0) {
    if (count[n_stride] != 1) ret = 0;
  }
  return ret;
#else
  int i;
  int ret = 1;
  int stridelen = 1;
  /* NOTE: The count array contains the length of the final dimension and could
   * be used to evaluate some corner cases that are not picked up by this
   * algorithm
   */ 
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if (stridelen < src_stride[i] || stridelen < dst_stride[i]) {
      ret = 0;
      break;
    }
  }
  return ret;
#endif
}